

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_symphony.c
# Opt level: O0

int32_t ll_get_gateway_scan_results
                  (llabs_gateway_scan_results_t (*scan_results) [16],uint8_t *num_gw)

{
  int32_t iVar1;
  llabs_gateway_scan_results_t *plVar2;
  undefined1 auStack_2e [2];
  int32_t ret;
  llabs_gateway_scan_results_t scan_result;
  uint8_t gw;
  uint8_t *num_gw_local;
  llabs_gateway_scan_results_t (*scan_results_local) [16];
  
  scan_result.id._5_1_ = 0;
  *num_gw = '\0';
  unique0x100000a7 = num_gw;
  do {
    iVar1 = ll_poll_scan_result((llabs_gateway_scan_results_t *)auStack_2e,
                                (uint8_t *)((long)&scan_result.id + 5));
    if (iVar1 != 0) {
      return iVar1;
    }
    if (*stack0xffffffffffffffe0 == '\0') {
      *stack0xffffffffffffffe0 = scan_result.id._5_1_ + 1;
    }
    plVar2 = *scan_results + scan_result.id._5_1_;
    plVar2->id = _auStack_2e;
    plVar2->rssi = (undefined2)scan_result.id;
    plVar2->snr = scan_result.id._2_1_;
    plVar2->channel = scan_result.id._3_1_;
    plVar2->is_repeater = scan_result.id._4_1_;
  } while (scan_result.id._5_1_ != 0);
  return 0;
}

Assistant:

int32_t ll_get_gateway_scan_results(llabs_gateway_scan_results_t (*scan_results)[MAX_GW_SCAN_RESULTS],
                            uint8_t *num_gw)
{
    uint8_t gw=0;
    *num_gw = 0;

    do
    {
        llabs_gateway_scan_results_t scan_result;

        int32_t ret = ll_poll_scan_result(&scan_result, &gw);
        // if scanning will return a NACK_BUSY (6)
        // if done scanning, but no gateways will return NACK_NO_DATA but no paylaod
        // if done scanning, and gateway, will return LL_IFC_ACK and gw will be an index (0-?) 
        //  and decrement each time called until gw is zero.  Zero is a valid gateway index and last
        // one in the list.
        //
        if (ret != LL_IFC_ACK)
        {
            return ret;
        }

        // When num_gw is uninitialized, we need to set it with the total
        // amount of gateways.  The interface decrements num_gw to use as an index prior to 
        // sending so we need to add one for number.
        //
        if (*num_gw == 0)
        {
            *num_gw = gw + 1;
        }

        memcpy(&(*scan_results)[gw], &scan_result, sizeof(scan_result));

    } while (gw > 0);

    return LL_IFC_ACK;
}